

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_Node * getNodeType(UA_Server *server,UA_Node *node)

{
  UA_Boolean UVar1;
  UA_NodeStoreEntry **ppUVar2;
  uint uVar3;
  UA_Byte UVar4;
  size_t sVar5;
  UA_NodeId *nodeid;
  UA_NodeId local_48;
  
  UVar4 = '\0';
  uVar3 = node->nodeClass - UA_NODECLASS_OBJECT;
  if (uVar3 < 0x40) {
    if ((0x8000000080008000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      local_48.identifier.numeric = 0x28;
      if ((3UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
        return (UA_Node *)0x0;
      }
    }
    else {
      UVar4 = '\x01';
      local_48.identifier.numeric = 0x2d;
    }
    local_48.namespaceIndex = 0;
    local_48.identifierType = UA_NODEIDTYPE_NUMERIC;
    sVar5 = node->referencesSize;
    if (sVar5 != 0) {
      nodeid = &(node->references->targetId).nodeId;
      do {
        if ((UVar4 == nodeid[-1].identifier.guid.data4[0]) &&
           (UVar1 = UA_NodeId_equal((UA_NodeId *)((long)&nodeid[-2].identifier + 8),&local_48),
           UVar1)) {
          ppUVar2 = findNode(server->nodestore,nodeid);
          if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
            return (UA_Node *)0x0;
          }
          return &(*ppUVar2)->node;
        }
        nodeid = (UA_NodeId *)&nodeid[3].identifier;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
  }
  return (UA_Node *)0x0;
}

Assistant:

const UA_Node *
getNodeType(UA_Server *server, const UA_Node *node) {
    /* The reference to the parent is different for variable and variabletype */
    UA_NodeId parentRef;
    UA_Boolean inverse;
    if(node->nodeClass == UA_NODECLASS_VARIABLE ||
       node->nodeClass == UA_NODECLASS_OBJECT) {
        parentRef = UA_NODEID_NUMERIC(0, UA_NS0ID_HASTYPEDEFINITION);
        inverse = false;
    } else if(node->nodeClass == UA_NODECLASS_VARIABLETYPE ||
              /* node->nodeClass == UA_NODECLASS_OBJECTTYPE || // objecttype may have multiple parents */
              node->nodeClass == UA_NODECLASS_REFERENCETYPE ||
              node->nodeClass == UA_NODECLASS_DATATYPE) {
        parentRef = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
        inverse = true;
    } else {
        return NULL;
    }

    /* stop at the first matching candidate */
    UA_NodeId *parentId = NULL;
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(node->references[i].isInverse == inverse &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &parentRef)) {
            parentId = &node->references[i].targetId.nodeId;
            break;
        }
    }

    if(!parentId)
        return NULL;
    return UA_NodeStore_get(server->nodestore, parentId);
}